

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O1

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitExpr
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,AssignmentExpression *expr)

{
  bool bVar1;
  
  ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
            (expr->left_,expr->left_,(TestAnalysis *)this);
  bVar1 = ast::AssignmentExpression::isLValueArg(expr);
  if (bVar1) {
    return;
  }
  ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
            (expr->right_,expr->right_,(TestAnalysis *)this);
  return;
}

Assistant:

void visitExpr(const AssignmentExpression& expr) {
        // Of note, if this is a nonblocking assignment we
        // still visit the left and right sides now, but the
        // actual assignment won't happen immediately.
        visit(expr.left());
        if (!expr.isLValueArg())
            visit(expr.right());
    }